

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test::TestBody
          (SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test *this)

{
  string source;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "\n  fn f(): function\n  {\n    ret \\(x: f32): void = { };\n  }\n  \n  fn main(): f32\n  {\n    let x: f32 = 12;\n    x = f();\n    ret 0;\n  }\n  "
             ,&local_29);
  throwTest(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAssignmentTypeMismatchThrows3)
{
  std::string source = R"SRC(
  fn f(): function
  {
    ret \(x: f32): void = { };
  }
  
  fn main(): f32
  {
    let x: f32 = 12;
    x = f();
    ret 0;
  }
  )SRC";
  throwTest(source);
}